

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArNESTResult * __thiscall
NEST::LArNEST::FullCalculation
          (LArNESTResult *__return_storage_ptr__,LArNEST *this,LArInteraction species,double energy,
          double dx,double efield,double density,bool do_times)

{
  long lVar1;
  LArYieldResult *pLVar2;
  LArNESTResult *pLVar3;
  byte bVar4;
  LArYieldResult local_60;
  
  bVar4 = 0;
  if (density < 1.0) {
    ((this->super_NESTcalc).fdetector)->inGas = true;
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetYields(&local_60,this,species,energy,dx,efield,density);
  pLVar2 = &local_60;
  pLVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pLVar3->yields).TotalYield = pLVar2->TotalYield;
    pLVar2 = (LArYieldResult *)((long)pLVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pLVar3 = (LArNESTResult *)((long)pLVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  GetYieldFluctuations
            ((LArYieldFluctuationResult *)&local_60,this,species,&__return_storage_ptr__->yields,
             density);
  (__return_storage_ptr__->fluctuations).NexFluctuation = local_60.LightYield;
  (__return_storage_ptr__->fluctuations).NionFluctuation = local_60.Nph;
  (__return_storage_ptr__->fluctuations).NphFluctuation = local_60.TotalYield;
  (__return_storage_ptr__->fluctuations).NeFluctuation = local_60.QuantaYield;
  return __return_storage_ptr__;
}

Assistant:

LArNESTResult LArNEST::FullCalculation(LArInteraction species, double energy,
                                       double dx, double efield, double density,
                                       bool do_times) {
  if (density < 1.) fdetector->set_inGas(true);
  LArNESTResult result;
  result.yields = GetYields(species, energy, dx, efield, density);
  result.fluctuations = GetYieldFluctuations(species, result.yields, density);
  // if (do_times)
  //     result.photon_times = GetPhotonTimes(
  //         species, result.quanta.photons,
  //         result.quanta.excitons, efield, energy
  //     );
  // else {
  //     result.photon_times = photonstream(result.quanta.photons, 0.0);
  // }
  return result;
}